

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

bool __thiscall
FIX::double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  uint local_48;
  int local_44;
  Chunk most_significant_bigit;
  int j_1;
  Chunk current_bigit;
  int i_1;
  int j;
  int i;
  int string_index;
  int needed_chars;
  int kHexCharsPerBigit;
  int buffer_size_local;
  char *buffer_local;
  Bignum *this_local;
  
  bVar1 = IsClamped(this);
  if (!bVar1) {
    __assert_fail("IsClamped()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x23c,"bool FIX::double_conversion::Bignum::ToHexString(char *, int) const");
  }
  if (this->used_digits_ == 0) {
    if (buffer_size < 2) {
      this_local._7_1_ = false;
    }
    else {
      *buffer = '0';
      buffer[1] = '\0';
      this_local._7_1_ = true;
    }
  }
  else {
    iVar3 = BigitLength(this);
    puVar5 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_ + -1);
    iVar4 = SizeInHexChars<unsigned_int>(*puVar5);
    iVar4 = (iVar3 + -1) * 7 + iVar4;
    if (buffer_size < iVar4 + 1) {
      this_local._7_1_ = false;
    }
    else {
      j = iVar4 + -1;
      buffer[iVar4] = '\0';
      for (i_1 = 0; i_1 < this->exponent_; i_1 = i_1 + 1) {
        for (current_bigit = 0; (int)current_bigit < 7; current_bigit = current_bigit + 1) {
          buffer[j] = '0';
          j = j + -1;
        }
      }
      for (j_1 = 0; j_1 < this->used_digits_ + -1; j_1 = j_1 + 1) {
        puVar5 = Vector<unsigned_int>::operator[](&this->bigits_,j_1);
        most_significant_bigit = *puVar5;
        for (local_44 = 0; local_44 < 7; local_44 = local_44 + 1) {
          cVar2 = HexCharOfValue(most_significant_bigit & 0xf);
          buffer[j] = cVar2;
          most_significant_bigit = most_significant_bigit >> 4;
          j = j + -1;
        }
      }
      puVar5 = Vector<unsigned_int>::operator[](&this->bigits_,this->used_digits_ + -1);
      for (local_48 = *puVar5; local_48 != 0; local_48 = local_48 >> 4) {
        cVar2 = HexCharOfValue(local_48 & 0xf);
        buffer[j] = cVar2;
        j = j + -1;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Bignum::ToHexString(char* buffer, int buffer_size) const {
  ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  ASSERT(kBigitSize % 4 == 0);
  const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_digits_ == 0) {
    if (buffer_size < 2) return false;
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
      SizeInHexChars(bigits_[used_digits_ - 1]) + 1;
  if (needed_chars > buffer_size) return false;
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_digits_ - 1; ++i) {
    Chunk current_bigit = bigits_[i];
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = bigits_[used_digits_ - 1];
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}